

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O1

void __thiscall chrono::ChAparticle::ContactForceLoadQ(ChAparticle *this)

{
  ChState *in_RCX;
  ChVector<double> *in_RDX;
  ChVector<double> *in_RSI;
  ChVectorDynamic<> *in_R8;
  int in_R9D;
  
  ContactForceLoadQ(this,in_RSI,in_RDX,in_RCX,in_R8,in_R9D);
  return;
}

Assistant:

void ChAparticle::ContactForceLoadQ(const ChVector<>& F,
                                    const ChVector<>& point,
                                    const ChState& state_x,
                                    ChVectorDynamic<>& Q,
                                    int offset) {
    ChCoordsys<> csys(state_x.segment(0, 7));
    ChVector<> point_loc = csys.TransformPointParentToLocal(point);
    ChVector<> force_loc = csys.TransformDirectionParentToLocal(F);
    ChVector<> torque_loc = Vcross(point_loc, force_loc);
    Q.segment(offset + 0, 3) = F.eigen();
    Q.segment(offset + 3, 3) = torque_loc.eigen();
}